

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O2

void __thiscall ccs::CcsDomain::logRuleDag(CcsDomain *this,ostream *os)

{
  Node *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  Dumper local_20;
  
  std::__shared_ptr<ccs::Node_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ccs::Node,void>
            ((__shared_ptr<ccs::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             &(((this->dag)._M_t.
                super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
                super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
                super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl)->root_).
              super___shared_ptr<ccs::Node,_(__gnu_cxx::_Lock_policy)2>);
  local_20._vptr_Dumper = (_func_int **)&PTR__Dumper_001973d8;
  local_20.node_ = local_30;
  ccs::operator<<(os,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

void CcsDomain::logRuleDag(std::ostream &os) const {
  os << Dumper(*dag->root());
}